

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult
testing::internal::CmpHelperSTRCASENE(char *s1_expression,char *s2_expression,char *s1,char *s2)

{
  int iVar1;
  AssertionResult *pAVar2;
  char *in_RCX;
  undefined8 in_RDX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult *in_RDI;
  char *in_R8;
  AssertionResult AVar4;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  AssertionResult local_20;
  
  sVar3.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71((int7)((ulong)in_RDX >> 8),in_R8 == (char *)0x0 || in_RCX == (char *)0x0);
  if (in_R8 == (char *)0x0 || in_RCX == (char *)0x0) {
    if (in_RCX != (char *)0x0 || in_R8 != (char *)0x0) {
LAB_00114f12:
      in_RDI->success_ = true;
      (in_RDI->message_).ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      goto LAB_00114f1d;
    }
  }
  else {
    iVar1 = strcasecmp(in_RCX,in_R8);
    sVar3.ptr_ = extraout_RDX_00;
    if (iVar1 != 0) goto LAB_00114f12;
  }
  local_20.success_ = false;
  local_20.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pAVar2 = AssertionResult::operator<<(&local_20,(char (*) [12])"Expected: (");
  pAVar2 = AssertionResult::operator<<(pAVar2,&local_28);
  pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") != (");
  pAVar2 = AssertionResult::operator<<(pAVar2,&local_30);
  pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [29])") (ignoring case), actual: \"");
  pAVar2 = AssertionResult::operator<<(pAVar2,&local_38);
  pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])"\" vs \"");
  pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
  pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x13109f);
  AssertionResult::AssertionResult(in_RDI,pAVar2);
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar3.ptr_ = extraout_RDX;
LAB_00114f1d:
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = in_RDI;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperSTRCASENE(const char* s1_expression,
                                   const char* s2_expression,
                                   const char* s1,
                                   const char* s2) {
  if (!String::CaseInsensitiveCStringEquals(s1, s2)) {
    return AssertionSuccess();
  } else {
    return AssertionFailure()
        << "Expected: (" << s1_expression << ") != ("
        << s2_expression << ") (ignoring case), actual: \""
        << s1 << "\" vs \"" << s2 << "\"";
  }
}